

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_compress_destSize(char *src,char *dst,int *srcSizePtr,int targetDstSize)

{
  ulong *puVar1;
  int *piVar2;
  int iVar3;
  bool bVar4;
  short sVar5;
  long lVar6;
  char cVar7;
  BYTE *s;
  ulong uVar8;
  int *piVar9;
  ulong uVar10;
  long *plVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  ulong *puVar15;
  uint uVar16;
  ulong *puVar17;
  long *plVar18;
  long *plVar19;
  int iVar20;
  ulong uVar21;
  int iVar22;
  int *piVar23;
  int *piVar24;
  int *piVar25;
  long *plVar26;
  char *pcVar27;
  short *psVar28;
  char cVar29;
  short *__s;
  long *plVar30;
  short *psVar31;
  int *in_R8;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  char *pcVar35;
  int iVar36;
  long lVar37;
  uint uVar38;
  LZ4_stream_t ctxBody;
  long *local_40d0;
  int local_40a8;
  uint local_4050 [4096];
  uint local_50;
  undefined2 local_4a;
  int local_38;
  
  iVar20 = 0;
  memset(local_4050,0,0x4020);
  uVar12 = *srcSizePtr;
  uVar14 = (ulong)(int)uVar12;
  if (uVar14 < 0x7e000001) {
    iVar20 = (uint)((ulong)uVar12 * 0x8080808081 >> 0x27) + 0x10;
  }
  if (iVar20 <= targetDstSize) {
    iVar20 = LZ4_compress_fast_extState(local_4050,src,dst,uVar12,targetDstSize,1);
    return iVar20;
  }
  lVar37 = (long)src - (ulong)local_50;
  pcVar35 = dst + targetDstSize;
  iVar36 = (int)lVar37;
  local_40a8 = (int)src;
  iVar20 = (int)dst;
  if ((int)uVar12 < 0x1000b) {
    if (0 < targetDstSize && uVar12 < 0x7e000001) {
      local_38 = local_38 + uVar12;
      local_4a = 3;
      piVar25 = (int *)src;
      uVar38 = local_50 + uVar12;
      if (0xc < (int)uVar12) {
        *(short *)((long)local_4050 + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) =
             (short)local_50;
        piVar24 = (int *)(src + 1);
        uVar38 = (uint)(*(int *)(src + 1) * -0x61c8864f) >> 0x13;
        psVar31 = (short *)dst;
        local_50 = local_50 + uVar12;
        do {
          uVar12 = 0x40;
          uVar16 = 1;
          do {
            piVar23 = piVar24;
            piVar24 = (int *)((ulong)uVar16 + (long)piVar23);
            sVar5 = (short)lVar37;
            if (src + (uVar14 - 0xb) < piVar24) {
              iVar36 = 2;
            }
            else {
              uVar21 = (ulong)*(ushort *)((long)local_4050 + (ulong)uVar38 * 2);
              iVar22 = *piVar24;
              *(short *)((long)local_4050 + (ulong)uVar38 * 2) = (short)piVar23 - sVar5;
              iVar36 = 7;
              if (*(int *)(lVar37 + uVar21) != *piVar23) {
                iVar36 = 0;
              }
              in_R8 = (int *)(uVar21 + lVar37);
              uVar38 = (uint)(iVar22 * -0x61c8864f) >> 0x13;
            }
            uVar16 = uVar12 >> 6;
            uVar12 = uVar12 + 1;
          } while (iVar36 == 0);
          if (iVar36 == 7) {
            iVar36 = 0;
          }
          piVar24 = piVar23;
          dst = (char *)psVar31;
          if (iVar36 == 0) {
            iVar36 = (int)piVar23 - (int)piVar25;
            lVar6 = 0;
            cVar7 = (char)piVar23 * '\x10' + (char)piVar25 * -0x10;
            uVar12 = iVar36 - 0xfU;
            do {
              uVar16 = uVar12;
              cVar29 = cVar7;
              lVar34 = lVar6;
              piVar2 = (int *)((long)in_R8 + lVar34);
              piVar24 = (int *)(lVar34 + (long)piVar23);
              if ((piVar2 <= src) || (piVar24 <= piVar25)) break;
              lVar6 = lVar34 + -1;
              cVar7 = cVar29 + -0x10;
              uVar12 = uVar16 - 1;
            } while (*(char *)((long)piVar23 + lVar34 + -1) == *(char *)((long)in_R8 + lVar34 + -1))
            ;
            iVar22 = (int)lVar34;
            uVar21 = (ulong)(uint)(iVar22 + ((int)piVar23 - (int)piVar25));
            pcVar27 = (char *)((long)psVar31 + uVar21 + (ulong)(iVar36 + iVar22 + 0xf0) / 0xff + 0xc
                              );
            if (pcVar35 < pcVar27) {
              iVar36 = 2;
              psVar28 = psVar31;
            }
            else {
              __s = (short *)((long)psVar31 + 1);
              if ((uint)(iVar36 + iVar22) < 0xf) {
                *(char *)psVar31 = cVar29;
              }
              else {
                uVar8 = (ulong)(iVar36 - 0xfU) + lVar34;
                *(char *)psVar31 = -0x10;
                if (0xfe < (int)uVar8) {
                  if (0x1fc < (int)uVar16) {
                    uVar16 = 0x1fd;
                  }
                  uVar12 = (iVar36 - uVar16) + iVar22 + 0xef;
                  uVar8 = (ulong)uVar12 / 0xff;
                  memset(__s,0xff,(ulong)(uVar12 / 0xff + 1));
                  __s = (short *)((long)psVar31 + uVar8 + 2);
                  uVar8 = (ulong)(uint)(iVar36 + -0x10e + iVar22 + (int)uVar8 * -0xff);
                }
                *(char *)__s = (char)uVar8;
                __s = (short *)((long)__s + 1);
              }
              psVar28 = (short *)(uVar21 + (long)__s);
              piVar9 = piVar25;
              do {
                *(undefined8 *)__s = *(undefined8 *)piVar9;
                __s = __s + 4;
                piVar9 = piVar9 + 2;
              } while (__s < psVar28);
              iVar36 = 0;
            }
            in_R8 = piVar2;
            dst = (char *)psVar28;
            if (pcVar27 <= pcVar35) {
              iVar36 = 2;
              do {
                dst = (char *)psVar31;
                if (pcVar35 < (char *)((long)psVar28 + 0xb)) goto LAB_00113b7f;
                *psVar28 = (short)piVar24 - (short)in_R8;
                puVar1 = (ulong *)(piVar24 + 1);
                puVar17 = (ulong *)(in_R8 + 1);
                puVar15 = puVar1;
                if (puVar1 < src + (uVar14 - 0xc)) {
                  uVar8 = *(ulong *)(piVar24 + 1) ^ *(ulong *)(in_R8 + 1);
                  uVar21 = 0;
                  if (uVar8 != 0) {
                    for (; (uVar8 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                    }
                  }
                  uVar21 = uVar21 >> 3 & 0x1fffffff;
                  puVar15 = (ulong *)(piVar24 + 3);
                  puVar17 = (ulong *)(in_R8 + 3);
                  if (*(ulong *)(in_R8 + 1) == *(ulong *)(piVar24 + 1)) goto LAB_0011391c;
                }
                else {
LAB_0011391c:
                  do {
                    if (src + (uVar14 - 0xc) <= puVar15) {
                      if ((puVar15 < src + (uVar14 - 8)) && ((int)*puVar17 == (int)*puVar15)) {
                        puVar15 = (ulong *)((long)puVar15 + 4);
                        puVar17 = (ulong *)((long)puVar17 + 4);
                      }
                      if ((puVar15 < src + (uVar14 - 6)) && ((short)*puVar17 == (short)*puVar15)) {
                        puVar15 = (ulong *)((long)puVar15 + 2);
                        puVar17 = (ulong *)((long)puVar17 + 2);
                      }
                      if (puVar15 < src + (uVar14 - 5)) {
                        puVar15 = (ulong *)((long)puVar15 +
                                           (ulong)((char)*puVar17 == (char)*puVar15));
                      }
                      uVar21 = (ulong)(uint)((int)puVar15 - (int)puVar1);
                      goto LAB_00113959;
                    }
                    uVar21 = *puVar17;
                    uVar8 = *puVar15;
                    uVar32 = uVar8 ^ uVar21;
                    uVar10 = 0;
                    if (uVar32 != 0) {
                      for (; (uVar32 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                      }
                    }
                    iVar22 = (int)puVar15;
                    puVar17 = puVar17 + 1;
                    puVar15 = puVar15 + 1;
                  } while (uVar21 == uVar8);
                  uVar21 = (ulong)((((uint)(uVar10 >> 3) & 0x1fffffff) + iVar22) - (int)puVar1);
                }
LAB_00113959:
                dst = (char *)(psVar28 + 1);
                uVar12 = (uint)uVar21;
                piVar25 = (int *)((long)piVar24 + uVar21 + 4);
                if (pcVar35 < (char *)((long)psVar28 + (ulong)(uVar12 + 0xf0) / 0xff + 8)) {
                  uVar16 = ((int)pcVar35 - (int)dst) * 0xff - 0x5ec;
                  piVar25 = (int *)((long)piVar25 - (ulong)(uVar12 - uVar16));
                  for (piVar24 = piVar25; uVar12 = uVar16, piVar24 <= piVar23;
                      piVar24 = (int *)((long)piVar24 + 1)) {
                    *(undefined2 *)
                     ((long)local_4050 + (ulong)((uint)(*piVar24 * -0x61c8864f) >> 0x13) * 2) = 0;
                  }
                }
                if (uVar12 < 0xf) {
                  *(char *)psVar31 = (char)*psVar31 + (char)uVar12;
                }
                else {
                  *(char *)psVar31 = (char)*psVar31 + '\x0f';
                  uVar16 = uVar12 - 0xf;
                  *(short *)((long)dst + 0) = -1;
                  *(short *)((long)dst + 2) = -1;
                  if (0x3fb < uVar16) {
                    uVar12 = uVar12 - 0x40b;
                    memset(psVar28 + 3,0xff,(ulong)((uVar12 / 0x3fc) * 4 + 4));
                    uVar16 = uVar12 % 0x3fc;
                    dst = (char *)((long)psVar28 + (ulong)((uVar12 / 0x3fc) * 4) + 6);
                  }
                  pcVar27 = (char *)((long)dst + (ulong)uVar16 / 0xff);
                  dst = pcVar27 + 1;
                  *pcVar27 = (char)((ulong)uVar16 * 0x8080808081 >> 0x27);
                }
                piVar24 = piVar25;
                if (src + (uVar14 - 0xb) <= piVar25) {
                  iVar36 = 3;
                  goto LAB_00113b7f;
                }
                *(short *)((long)local_4050 +
                          (ulong)((uint)(*(int *)((long)piVar25 + -2) * -0x61c8864f) >> 0x13) * 2) =
                     ((short)piVar25 + -2) - sVar5;
                uVar21 = (ulong)((uint)(*piVar25 * -0x61c8864f) >> 0x13);
                uVar8 = (ulong)*(ushort *)((long)local_4050 + uVar21 * 2);
                *(short *)((long)local_4050 + uVar21 * 2) = (short)piVar25 - sVar5;
                iVar22 = *(int *)(lVar37 + uVar8);
                iVar13 = *piVar25;
                psVar28 = (short *)dst;
                if (iVar22 == iVar13) {
                  *dst = '\0';
                  psVar28 = (short *)((long)dst + 1);
                  psVar31 = (short *)dst;
                }
                in_R8 = (int *)(uVar8 + lVar37);
              } while (iVar22 == iVar13);
              uVar38 = (uint)(*(int *)((long)piVar25 + 1) * -0x61c8864f) >> 0x13;
              iVar36 = 0;
              piVar24 = (int *)((long)piVar25 + 1);
              dst = (char *)psVar28;
            }
          }
LAB_00113b7f:
          psVar31 = (short *)dst;
        } while (iVar36 == 0);
        uVar38 = local_50;
        if (1 < iVar36 - 2U) {
          return 0;
        }
      }
      local_50 = uVar38;
      pcVar27 = src + (uVar14 - (long)piVar25);
      if (pcVar35 < (char *)((long)dst + (long)(pcVar27 + (ulong)(pcVar27 + 0xf0) / 0xff + 1))) {
        pcVar27 = pcVar35 + (~(ulong)dst - (ulong)(pcVar35 + ~(ulong)dst + 0xf0) / 0xff);
      }
      if (pcVar27 < (char *)0xf) {
        *dst = (char)pcVar27 << 4;
      }
      else {
        pcVar35 = pcVar27 + -0xf;
        *dst = -0x10;
        psVar31 = (short *)((long)dst + 1);
        if ((char *)0xfe < pcVar35) {
          uVar14 = (ulong)(pcVar27 + -0x10e) / 0xff;
          memset(psVar31,0xff,uVar14 + 1);
          psVar31 = (short *)((long)dst + uVar14 + 2);
          pcVar35 = pcVar27 + uVar14 * -0xff + -0x10e;
        }
        *(char *)psVar31 = (char)pcVar35;
        dst = (char *)psVar31;
      }
      memcpy((char *)((long)dst + 1),piVar25,(size_t)pcVar27);
      *srcSizePtr = ((int)piVar25 + (int)pcVar27) - local_40a8;
      return ((int)(char *)((long)dst + 1) + (int)pcVar27) - iVar20;
    }
  }
  else if (0 < targetDstSize && uVar12 < 0x7e000001) {
    local_38 = local_38 + uVar12;
    local_4a = 2;
    local_4050[(ulong)(*(long *)src * -0x30e4432345000000) >> 0x34] = local_50;
    plVar18 = (long *)(src + 1);
    uVar21 = (ulong)(*(long *)(src + 1) * -0x30e4432345000000) >> 0x34;
    local_40d0 = (long *)src;
    local_50 = uVar12 + local_50;
    do {
      uVar12 = 0x40;
      uVar8 = 1;
      plVar26 = plVar18;
      while( true ) {
        plVar18 = (long *)(uVar8 + (long)plVar26);
        iVar22 = (int)plVar26;
        if (src + (uVar14 - 0xb) < plVar18) {
          iVar13 = 2;
        }
        else {
          uVar38 = local_4050[uVar21];
          in_R8 = (int *)((ulong)uVar38 + lVar37);
          uVar8 = (ulong)(*plVar18 * -0x30e4432345000000) >> 0x34;
          local_4050[uVar21] = iVar22 - iVar36;
          iVar13 = 8;
          uVar21 = uVar8;
          if (((uint)(iVar22 - iVar36) <= uVar38 + 0xffff) && (iVar13 = 7, *in_R8 != (int)*plVar26))
          {
            iVar13 = 0;
          }
        }
        if ((iVar13 != 0) && (iVar13 != 8)) break;
        uVar8 = (ulong)(uVar12 >> 6);
        uVar12 = uVar12 + 1;
        plVar26 = plVar18;
      }
      if (iVar13 == 7) {
        iVar13 = 0;
      }
      plVar30 = (long *)dst;
      plVar18 = plVar26;
      if (iVar13 == 0) {
        iVar13 = iVar22 - (int)local_40d0;
        lVar6 = 0;
        cVar7 = (char)plVar26 * '\x10' + (char)local_40d0 * -0x10;
        uVar12 = iVar13 - 0xfU;
        do {
          uVar38 = uVar12;
          cVar29 = cVar7;
          lVar34 = lVar6;
          piVar25 = (int *)((long)in_R8 + lVar34);
          plVar18 = (long *)(lVar34 + (long)plVar26);
          if ((piVar25 <= src) || (plVar18 <= local_40d0)) break;
          lVar6 = lVar34 + -1;
          cVar7 = cVar29 + -0x10;
          uVar12 = uVar38 - 1;
        } while (*(char *)((long)plVar26 + lVar34 + -1) == *(char *)((long)in_R8 + lVar34 + -1));
        iVar3 = (int)lVar34;
        uVar8 = (ulong)(uint)((iVar22 - (int)local_40d0) + iVar3);
        pcVar27 = (char *)((long)dst + uVar8 + (ulong)(iVar13 + iVar3 + 0xf0) / 0xff + 0xc);
        if (pcVar35 < pcVar27) {
          iVar13 = 2;
          plVar19 = (long *)dst;
        }
        else {
          plVar30 = (long *)((long)dst + 1);
          if ((uint)(iVar13 + iVar3) < 0xf) {
            *dst = cVar29;
          }
          else {
            uVar10 = (ulong)(iVar13 - 0xfU) + lVar34;
            *dst = -0x10;
            if (0xfe < (int)uVar10) {
              if (0x1fc < (int)uVar38) {
                uVar38 = 0x1fd;
              }
              uVar12 = (iVar13 - uVar38) + iVar3 + 0xef;
              uVar10 = (ulong)uVar12 / 0xff;
              memset(plVar30,0xff,(ulong)(uVar12 / 0xff + 1));
              plVar30 = (long *)((long)dst + uVar10 + 2);
              uVar10 = (ulong)(uint)(iVar13 + -0x10e + iVar3 + (int)uVar10 * -0xff);
            }
            *(char *)plVar30 = (char)uVar10;
            plVar30 = (long *)((long)plVar30 + 1);
          }
          plVar19 = (long *)(uVar8 + (long)plVar30);
          plVar11 = local_40d0;
          do {
            *plVar30 = *plVar11;
            plVar30 = plVar30 + 1;
            plVar11 = plVar11 + 1;
          } while (plVar30 < plVar19);
          iVar13 = 0;
        }
        in_R8 = piVar25;
        plVar30 = plVar19;
        if (pcVar27 <= pcVar35) {
          iVar13 = 2;
          do {
            plVar30 = (long *)dst;
            if (pcVar35 < (char *)((long)plVar19 + 0xb)) goto LAB_001141b6;
            *(short *)plVar19 = (short)plVar18 - (short)in_R8;
            puVar1 = (ulong *)((long)plVar18 + 4);
            puVar17 = (ulong *)(in_R8 + 1);
            puVar15 = puVar1;
            if (puVar1 < src + (uVar14 - 0xc)) {
              uVar10 = *(ulong *)((long)plVar18 + 4) ^ *(ulong *)(in_R8 + 1);
              uVar8 = 0;
              if (uVar10 != 0) {
                for (; (uVar10 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                }
              }
              uVar8 = uVar8 >> 3 & 0x1fffffff;
              puVar15 = (ulong *)((long)plVar18 + 0xc);
              puVar17 = (ulong *)(in_R8 + 3);
              if (*(ulong *)(in_R8 + 1) == *(ulong *)((long)plVar18 + 4)) goto LAB_00113f0f;
            }
            else {
LAB_00113f0f:
              do {
                if (src + (uVar14 - 0xc) <= puVar15) {
                  if ((puVar15 < src + (uVar14 - 8)) && ((int)*puVar17 == (int)*puVar15)) {
                    puVar15 = (ulong *)((long)puVar15 + 4);
                    puVar17 = (ulong *)((long)puVar17 + 4);
                  }
                  if ((puVar15 < src + (uVar14 - 6)) && ((short)*puVar17 == (short)*puVar15)) {
                    puVar15 = (ulong *)((long)puVar15 + 2);
                    puVar17 = (ulong *)((long)puVar17 + 2);
                  }
                  if (puVar15 < src + (uVar14 - 5)) {
                    puVar15 = (ulong *)((long)puVar15 + (ulong)((char)*puVar17 == (char)*puVar15));
                  }
                  uVar8 = (ulong)(uint)((int)puVar15 - (int)puVar1);
                  goto LAB_00113f4c;
                }
                uVar8 = *puVar17;
                uVar10 = *puVar15;
                uVar33 = uVar10 ^ uVar8;
                uVar32 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                  }
                }
                iVar22 = (int)puVar15;
                puVar17 = puVar17 + 1;
                puVar15 = puVar15 + 1;
              } while (uVar8 == uVar10);
              uVar8 = (ulong)((((uint)(uVar32 >> 3) & 0x1fffffff) + iVar22) - (int)puVar1);
            }
LAB_00113f4c:
            plVar30 = (long *)((long)plVar19 + 2);
            local_40d0 = (long *)((long)plVar18 + uVar8 + 4);
            if (pcVar35 < (char *)((long)plVar19 + (ulong)((int)uVar8 + 0xf0) / 0xff + 8)) {
              uVar12 = ((int)pcVar35 - (int)plVar30) * 0xff - 0x5ec;
              local_40d0 = (long *)((long)local_40d0 - (ulong)((int)uVar8 - uVar12));
              plVar18 = local_40d0;
              if (plVar26 < local_40d0) {
                uVar8 = (ulong)uVar12;
                goto LAB_00113f8c;
              }
              do {
                local_4050[(ulong)(*plVar18 * -0x30e4432345000000) >> 0x34] = 0;
                plVar18 = (long *)((long)plVar18 + 1);
              } while (plVar18 <= plVar26);
            }
            else {
LAB_00113f8c:
              uVar12 = (uint)uVar8;
            }
            if (uVar12 < 0xf) {
              *dst = (char)*(long *)dst + (char)uVar12;
            }
            else {
              *dst = (char)*(long *)dst + '\x0f';
              uVar38 = uVar12 - 0xf;
              *(undefined4 *)plVar30 = 0xffffffff;
              if (0x3fb < uVar38) {
                uVar12 = uVar12 - 0x40b;
                memset((char *)((long)plVar19 + 6),0xff,(ulong)((uVar12 / 0x3fc) * 4 + 4));
                uVar38 = uVar12 % 0x3fc;
                plVar30 = (long *)((long)plVar19 + (ulong)((uVar12 / 0x3fc) * 4) + 6);
              }
              pcVar27 = (char *)((long)plVar30 + (ulong)uVar38 / 0xff);
              plVar30 = (long *)(pcVar27 + 1);
              *pcVar27 = (char)((ulong)uVar38 * 0x8080808081 >> 0x27);
            }
            plVar18 = local_40d0;
            if (src + (uVar14 - 0xb) <= local_40d0) {
              iVar13 = 3;
              goto LAB_001141b6;
            }
            local_4050[(ulong)(*(long *)((long)local_40d0 + -2) * -0x30e4432345000000) >> 0x34] =
                 ((int)local_40d0 + -2) - iVar36;
            uVar8 = (ulong)(*local_40d0 * -0x30e4432345000000) >> 0x34;
            uVar38 = (int)local_40d0 - iVar36;
            uVar12 = local_4050[uVar8];
            in_R8 = (int *)((ulong)uVar12 + lVar37);
            local_4050[uVar8] = uVar38;
            bVar4 = true;
            plVar19 = plVar30;
            if ((uVar38 <= uVar12 + 0xffff) && (*in_R8 == (int)*local_40d0)) {
              *(char *)plVar30 = '\0';
              bVar4 = false;
              plVar19 = (long *)((long)plVar30 + 1);
              dst = (char *)plVar30;
            }
          } while (!bVar4);
          uVar21 = (ulong)(*(long *)((long)local_40d0 + 1) * -0x30e4432345000000) >> 0x34;
          iVar13 = 0;
          plVar30 = plVar19;
          plVar18 = (long *)((long)local_40d0 + 1);
        }
      }
LAB_001141b6:
      dst = (char *)plVar30;
    } while (iVar13 == 0);
    if (iVar13 - 2U < 2) {
      pcVar27 = src + (uVar14 - (long)local_40d0);
      if (pcVar35 < (char *)((long)plVar30 + (long)(pcVar27 + (ulong)(pcVar27 + 0xf0) / 0xff + 1)))
      {
        pcVar27 = pcVar35 + (~(ulong)plVar30 - (ulong)(pcVar35 + ~(ulong)plVar30 + 0xf0) / 0xff);
      }
      if (pcVar27 < (char *)0xf) {
        *(char *)plVar30 = (char)pcVar27 << 4;
      }
      else {
        pcVar35 = pcVar27 + -0xf;
        *(char *)plVar30 = -0x10;
        plVar18 = (long *)((long)plVar30 + 1);
        if ((char *)0xfe < pcVar35) {
          uVar14 = (ulong)(pcVar27 + -0x10e) / 0xff;
          memset(plVar18,0xff,uVar14 + 1);
          plVar18 = (long *)((long)plVar30 + uVar14 + 2);
          pcVar35 = pcVar27 + uVar14 * -0xff + -0x10e;
        }
        *(char *)plVar18 = (char)pcVar35;
        plVar30 = plVar18;
      }
      memcpy((char *)((long)plVar30 + 1),local_40d0,(size_t)pcVar27);
      *srcSizePtr = ((int)local_40d0 + (int)pcVar27) - local_40a8;
      return ((int)(char *)((long)plVar30 + 1) + (int)pcVar27) - iVar20;
    }
  }
  return 0;
}

Assistant:

int LZ4_compress_destSize(const char* src, char* dst, int* srcSizePtr, int targetDstSize)
{
#if (LZ4_HEAPMODE)
    LZ4_stream_t* ctx = (LZ4_stream_t*)ALLOC(sizeof(LZ4_stream_t));   /* malloc-calloc always properly aligned */
    if (ctx == NULL) return 0;
#else
    LZ4_stream_t ctxBody;
    LZ4_stream_t* ctx = &ctxBody;
#endif

    int result = LZ4_compress_destSize_extState(ctx, src, dst, srcSizePtr, targetDstSize);

#if (LZ4_HEAPMODE)
    FREEMEM(ctx);
#endif
    return result;
}